

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginTooltipEx(ImGuiTooltipFlags tooltip_flags,ImGuiWindowFlags extra_window_flags)

{
  float fVar1;
  short sVar2;
  ImGuiWindow *pIVar3;
  uint in_EDI;
  ImGuiWindowFlags flags;
  ImGuiWindow *window;
  char window_name [16];
  ImVec2 tooltip_pos;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_000003a4;
  bool *in_stack_000003a8;
  char *in_stack_000003b0;
  ImVec2 *lhs;
  ImVec2 *in_stack_ffffffffffffffb0;
  char local_38 [16];
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiContext *local_10;
  uint local_4;
  
  local_10 = GImGui;
  local_4 = in_EDI;
  if (((GImGui->DragDropWithinSource & 1U) != 0) || ((GImGui->DragDropWithinTarget & 1U) != 0)) {
    lhs = &(GImGui->IO).MousePos;
    fVar1 = (GImGui->Style).MouseCursorScale;
    in_stack_ffffffffffffffb0 = &local_20;
    ImVec2::ImVec2(in_stack_ffffffffffffffb0,fVar1 * 16.0,fVar1 * 8.0);
    local_18 = ::operator+(lhs,(ImVec2 *)0x4c270b);
    ImVec2::ImVec2(&local_28,0.0,0.0);
    SetNextWindowPos(&local_18,0,&local_28);
    SetNextWindowBgAlpha((local_10->Style).Colors[4].w * 0.6);
    local_4 = local_4 | 1;
  }
  ImFormatString(local_38,0x10,"##Tooltip_%02d",(ulong)(uint)(int)local_10->TooltipOverrideCount);
  if ((((local_4 & 1) != 0) &&
      (pIVar3 = FindWindowByName((char *)in_stack_ffffffffffffffb0), pIVar3 != (ImGuiWindow *)0x0))
     && ((pIVar3->Active & 1U) != 0)) {
    pIVar3->Hidden = true;
    pIVar3->HiddenFramesCanSkipItems = '\x01';
    sVar2 = local_10->TooltipOverrideCount + 1;
    local_10->TooltipOverrideCount = sVar2;
    ImFormatString(local_38,0x10,"##Tooltip_%02d",(ulong)(uint)(int)sVar2);
  }
  Begin(in_stack_000003b0,in_stack_000003a8,in_stack_000003a4);
  return;
}

Assistant:

void ImGui::BeginTooltipEx(ImGuiTooltipFlags tooltip_flags, ImGuiWindowFlags extra_window_flags)
{
    ImGuiContext& g = *GImGui;

    if (g.DragDropWithinSource || g.DragDropWithinTarget)
    {
        // The default tooltip position is a little offset to give space to see the context menu (it's also clamped within the current viewport/monitor)
        // In the context of a dragging tooltip we try to reduce that offset and we enforce following the cursor.
        // Whatever we do we want to call SetNextWindowPos() to enforce a tooltip position and disable clipping the tooltip without our display area, like regular tooltip do.
        //ImVec2 tooltip_pos = g.IO.MousePos - g.ActiveIdClickOffset - g.Style.WindowPadding;
        ImVec2 tooltip_pos = g.IO.MousePos + ImVec2(16 * g.Style.MouseCursorScale, 8 * g.Style.MouseCursorScale);
        SetNextWindowPos(tooltip_pos);
        SetNextWindowBgAlpha(g.Style.Colors[ImGuiCol_PopupBg].w * 0.60f);
        //PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * 0.60f); // This would be nice but e.g ColorButton with checkboard has issue with transparent colors :(
        tooltip_flags |= ImGuiTooltipFlags_OverridePreviousTooltip;
    }

    char window_name[16];
    ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", g.TooltipOverrideCount);
    if (tooltip_flags & ImGuiTooltipFlags_OverridePreviousTooltip)
        if (ImGuiWindow* window = FindWindowByName(window_name))
            if (window->Active)
            {
                // Hide previous tooltip from being displayed. We can't easily "reset" the content of a window so we create a new one.
                window->Hidden = true;
                window->HiddenFramesCanSkipItems = 1; // FIXME: This may not be necessary?
                ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", ++g.TooltipOverrideCount);
            }
    ImGuiWindowFlags flags = ImGuiWindowFlags_Tooltip | ImGuiWindowFlags_NoInputs | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_AlwaysAutoResize;
    Begin(window_name, NULL, flags | extra_window_flags);
}